

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  uint uVar1;
  U16 UVar2;
  int iVar3;
  size_t __n;
  ulong __n_00;
  byte *pbVar4;
  long in_RCX;
  byte *pbVar5;
  int in_EDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_R8;
  BYTE *oCopyLimit;
  BYTE *copyEnd;
  BYTE *matchEnd;
  size_t mlen;
  BYTE *copyFrom_1;
  BYTE *endOfMatch_1;
  size_t restSize_1;
  size_t copySize_1;
  variable_length_error error_3;
  variable_length_error error_2;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  variable_length_error error_1;
  variable_length_error error;
  size_t length;
  uint token;
  size_t offset;
  BYTE *match;
  BYTE *shortoend;
  BYTE *shortiend;
  int checkOffset;
  int safeDecode;
  BYTE *dictEnd;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  BYTE *e_1;
  BYTE *s_2;
  BYTE *d_1;
  BYTE *e_5;
  BYTE *s_9;
  BYTE *d_5;
  BYTE *e_6;
  BYTE *s_10;
  BYTE *d_6;
  BYTE *e_4;
  BYTE *s_7;
  BYTE *d_4;
  U32 s;
  U32 length_1;
  U32 s_3;
  U32 length_2;
  U32 s_6;
  U32 length_3;
  U32 s_8;
  U32 length_4;
  BYTE *e;
  BYTE *s_1;
  BYTE *d;
  BYTE *e_3;
  BYTE *s_5;
  BYTE *d_3;
  BYTE v [8];
  BYTE *e_2;
  BYTE *s_4;
  BYTE *d_2;
  byte *in_stack_fffffffffffffc28;
  byte *local_3d0;
  byte *local_3b8;
  long local_3a8;
  byte *local_358;
  int local_338;
  int local_334;
  byte *local_330;
  byte *local_328;
  ulong local_320;
  size_t local_318;
  int local_310;
  int local_30c;
  byte *local_308;
  uint local_2fc;
  ulong local_2f8;
  byte *local_2f0;
  byte *local_2e8;
  byte *local_2e0;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  byte *local_2c8;
  byte *local_2c0;
  byte *local_2b8;
  byte *local_2b0;
  byte *local_2a8;
  long local_2a0;
  byte *local_290;
  int local_284;
  int local_280;
  int local_27c;
  undefined4 local_274;
  byte *local_270;
  byte *local_268;
  int local_25c;
  byte *local_258;
  byte *local_250;
  byte *local_248;
  byte *local_240;
  byte *local_238;
  byte *local_230;
  byte *local_228;
  byte *local_220;
  byte *local_218;
  byte *local_210;
  byte *local_208;
  byte *local_200;
  byte *local_1f8;
  byte *local_1f0;
  byte *local_1e8;
  byte *local_1e0;
  byte *local_1d8;
  byte *local_1d0;
  byte *local_1c8;
  byte *local_1c0;
  byte *local_1b8;
  byte *local_1b0;
  byte *local_1a8;
  byte *local_1a0;
  uint local_198;
  uint local_194;
  int *local_190;
  int local_188;
  int local_184;
  byte *local_180;
  byte **local_178;
  uint local_16c;
  uint local_168;
  uint local_164;
  int *local_160;
  undefined4 local_158;
  int local_154;
  byte *local_150;
  byte **local_148;
  uint local_13c;
  uint local_138;
  uint local_134;
  int *local_130;
  int local_128;
  int local_124;
  byte *local_120;
  byte **local_118;
  uint local_10c;
  uint local_108;
  uint local_104;
  int *local_100;
  undefined4 local_f8;
  int local_f4;
  byte *local_f0;
  byte **local_e8;
  uint local_dc;
  byte *local_d8;
  byte *local_d0;
  byte *local_c8;
  byte *local_c0;
  byte *local_b8;
  byte *local_b0;
  byte *local_a8;
  byte *local_a0;
  byte *local_98;
  byte *local_90;
  byte *local_88;
  byte *local_80;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined4 uStack_74;
  ulong local_70;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  ulong local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  byte *local_30;
  byte *local_28;
  byte *local_20;
  byte *local_18;
  byte *local_10;
  byte *local_8;
  
  local_274 = 0;
  local_27c = 0;
  local_280 = 0;
  local_284 = 2;
  if (in_RDI == (byte *)0x0) {
    local_25c = -1;
  }
  else {
    local_2c0 = in_RSI + in_EDX;
    if (in_RCX == 0) {
      local_3a8 = 0;
    }
    else {
      local_3a8 = in_RCX + in_R8;
    }
    local_2d0 = local_3a8;
    local_2d4 = 0;
    local_2d8 = 0;
    local_2e0 = in_RDI + -10;
    local_2e8 = local_2c0 + -0x1a;
    if (in_EDX == 0) {
      local_25c = -1;
      if (*in_RDI == 0) {
        local_25c = 1;
      }
    }
    else {
      local_2b8 = in_RSI;
      local_2b0 = in_RDI;
      local_2a8 = in_RDI;
      local_2a0 = in_R8;
      local_290 = in_RSI;
      local_270 = in_RSI;
      local_268 = in_RDI;
      if (0x3f < (long)local_2c0 - (long)in_RSI) {
LAB_00312488:
        do {
          pbVar5 = local_2a8 + 1;
          local_2fc = (uint)*local_2a8;
          local_308 = (byte *)(ulong)(*local_2a8 >> 4);
          if (local_308 == (byte *)0xf) {
            local_30c = 0;
            local_180 = local_2b0 + -0xf;
            local_178 = &local_2a8;
            local_184 = local_27c;
            local_188 = local_27c;
            local_190 = &local_30c;
            local_194 = 0;
            local_2a8 = pbVar5;
            if ((local_27c == 0) || (pbVar5 < local_180)) {
              do {
                local_198 = (uint)**local_178;
                *local_178 = *local_178 + 1;
                local_194 = local_198 + local_194;
                if ((local_184 != 0) && (local_180 <= *local_178)) {
                  *local_190 = -2;
                  local_16c = local_194;
                  break;
                }
                local_16c = local_194;
              } while (local_198 == 0xff);
            }
            else {
              local_30c = -1;
              local_16c = 0;
            }
            local_308 = (byte *)((ulong)local_16c + (long)local_308);
            if (((local_30c == -1) ||
                ((local_2d4 != 0 && (local_2b8 + (long)local_308 < local_2b8)))) ||
               ((local_2d4 != 0 && (local_2a8 + (long)local_308 < local_2a8)))) goto LAB_00314517;
            local_2c8 = local_2b8 + (long)local_308;
            pbVar5 = local_2a8;
            local_194 = local_16c;
            if (local_27c == 0) {
              if (local_2c0 + -8 < local_2c8) goto LAB_00313856;
              local_230 = local_2b8;
              local_238 = local_2a8;
              local_248 = local_2b8;
              local_250 = local_2a8;
              do {
                *(undefined8 *)local_248 = *(undefined8 *)local_250;
                local_248 = local_248 + 8;
                local_250 = local_250 + 8;
                local_258 = local_2c8;
                local_240 = local_2c8;
              } while (local_248 < local_2c8);
            }
            else {
              if (local_2c0 + -0x20 < local_2c8) goto LAB_00313856;
              if (local_2b0 + -0x20 < local_2a8 + (long)local_308) goto LAB_00313856;
              local_b0 = local_2b8;
              local_b8 = local_2a8;
              local_c8 = local_2b8;
              local_d0 = local_2a8;
              do {
                *(undefined8 *)local_c8 = *(undefined8 *)local_d0;
                *(undefined8 *)(local_c8 + 8) = *(undefined8 *)(local_d0 + 8);
                *(undefined8 *)(local_c8 + 0x10) = *(undefined8 *)(local_d0 + 0x10);
                *(undefined8 *)(local_c8 + 0x18) = *(undefined8 *)(local_d0 + 0x18);
                local_c8 = local_c8 + 0x20;
                local_d0 = local_d0 + 0x20;
                local_d8 = local_2c8;
                local_c0 = local_2c8;
              } while (local_c8 < local_2c8);
            }
            local_2a8 = local_2a8 + (long)local_308;
            local_2b8 = local_2c8;
          }
          else {
            local_2c8 = local_2b8 + (long)local_308;
            if (local_27c == 0) {
              *(undefined8 *)local_2b8 = *(undefined8 *)pbVar5;
              if (8 < local_308) {
                *(undefined8 *)(local_2b8 + 8) = *(undefined8 *)(local_2a8 + 9);
              }
            }
            else {
              if (local_2b0 + -0x11 < pbVar5) goto LAB_00313856;
              *(undefined8 *)local_2b8 = *(undefined8 *)pbVar5;
              *(undefined8 *)(local_2b8 + 8) = *(undefined8 *)(local_2a8 + 9);
            }
            local_2a8 = pbVar5 + (long)local_308;
            local_2b8 = local_2c8;
          }
          local_2c8 = local_2b8;
          UVar2 = LZ4_readLE16(in_stack_fffffffffffffc28);
          local_2f8 = (ulong)UVar2;
          local_2a8 = local_2a8 + 2;
          local_2f0 = local_2b8 + -local_2f8;
          local_308 = (byte *)(ulong)(local_2fc & 0xf);
          if (local_308 == (byte *)0xf) {
            local_310 = 0;
            if ((local_2d8 == 0) || (local_290 <= local_2f0 + local_2a0)) {
              local_150 = local_2b0 + -4;
              local_148 = &local_2a8;
              local_154 = local_27c;
              local_158 = 0;
              local_160 = &local_310;
              local_164 = 0;
              do {
                local_168 = (uint)**local_148;
                *local_148 = *local_148 + 1;
                local_164 = local_168 + local_164;
                if ((local_154 != 0) && (local_150 <= *local_148)) {
                  *local_160 = -2;
                  local_13c = local_164;
                  break;
                }
                local_13c = local_164;
              } while (local_168 == 0xff);
              if ((local_310 != 0) ||
                 ((local_2d4 != 0 && (local_2b8 + (ulong)local_13c + (long)local_308 < local_2b8))))
              goto LAB_00314517;
              local_308 = (byte *)((ulong)local_13c + (long)local_308 + 4);
              local_164 = local_13c;
              if (local_2c0 + -0x40 <= local_2b8 + (long)local_308) goto LAB_00313d4b;
LAB_00312cff:
              if ((local_2d8 != 0) && (local_2f0 + local_2a0 < local_290)) goto LAB_00314517;
              if ((local_284 == 2) && (local_2f0 < local_290)) {
                if (local_2c0 + -5 < local_2b8 + (long)local_308) {
                  if (local_280 == 0) goto LAB_00314517;
                  if (local_308 < local_2c0 + -(long)local_2b8) {
                    local_3b8 = local_308;
                  }
                  else {
                    local_3b8 = local_2c0 + -(long)local_2b8;
                  }
                  local_308 = local_3b8;
                }
                if (local_290 + -(long)local_2f0 < local_308) {
                  local_318 = (long)local_290 - (long)local_2f0;
                  local_320 = (long)local_308 - local_318;
                  memcpy(local_2b8,(void *)(local_2d0 - local_318),local_318);
                  local_2b8 = local_2b8 + local_318;
                  if ((ulong)((long)local_2b8 - (long)local_290) < local_320) {
                    local_328 = local_2b8 + local_320;
                    local_330 = local_290;
                    while (local_2b8 < local_328) {
                      *local_2b8 = *local_330;
                      local_330 = local_330 + 1;
                      local_2b8 = local_2b8 + 1;
                    }
                  }
                  else {
                    memcpy(local_2b8,local_290,local_320);
                    local_2b8 = local_2b8 + local_320;
                  }
                }
                else {
                  memmove(local_2b8,(void *)(local_2d0 - ((long)local_290 - (long)local_2f0)),
                          (size_t)local_308);
                  local_2b8 = local_308 + (long)local_2b8;
                }
              }
              else {
                local_2c8 = local_2b8 + (long)local_308;
                if (local_2f8 < 0x10) {
                  local_58 = local_2b8;
                  local_60 = local_2f0;
                  local_70 = local_2f8;
                  local_68 = local_2c8;
                  if (local_2f8 == 1) {
                    memset(&local_78,(uint)*local_2f0,8);
                  }
                  else if (local_2f8 == 2) {
                    local_78 = *(undefined2 *)local_2f0;
                    uStack_76 = *(undefined2 *)local_2f0;
                    uStack_74 = CONCAT22(uStack_76,local_78);
                  }
                  else {
                    if (local_2f8 != 4) {
                      local_38 = local_2b8;
                      local_40 = local_2f0;
                      local_50 = local_2f8;
                      local_48 = local_2c8;
                      if (local_2f8 < 8) {
                        LZ4_write32(local_2b8,0);
                        *local_38 = *local_40;
                        local_38[1] = local_40[1];
                        local_38[2] = local_40[2];
                        local_38[3] = local_40[3];
                        uVar1 = inc32table[local_50];
                        *(undefined4 *)(local_38 + 4) = *(undefined4 *)(local_40 + uVar1);
                        local_40 = local_40 + uVar1 + -(long)dec64table[local_50];
                      }
                      else {
                        *(undefined8 *)local_2b8 = *(undefined8 *)local_2f0;
                        local_40 = local_2f0 + 8;
                      }
                      local_38 = local_38 + 8;
                      local_8 = local_38;
                      local_10 = local_40;
                      local_18 = local_48;
                      local_20 = local_38;
                      local_28 = local_40;
                      local_30 = local_48;
                      do {
                        *(undefined8 *)local_20 = *(undefined8 *)local_28;
                        local_20 = local_20 + 8;
                        local_28 = local_28 + 8;
                      } while (local_20 < local_48);
                      goto LAB_0031341d;
                    }
                    local_78 = (undefined2)*(undefined4 *)local_2f0;
                    uStack_76 = (undefined2)((uint)*(undefined4 *)local_2f0 >> 0x10);
                    uStack_74 = *(undefined4 *)local_2f0;
                  }
                  *(ulong *)local_58 = CONCAT44(uStack_74,CONCAT22(uStack_76,local_78));
                  while (local_58 = local_58 + 8, local_58 < local_68) {
                    *(ulong *)local_58 = CONCAT44(uStack_74,CONCAT22(uStack_76,local_78));
                  }
                }
                else {
                  local_80 = local_2b8;
                  local_88 = local_2f0;
                  local_98 = local_2b8;
                  local_a0 = local_2f0;
                  do {
                    *(undefined8 *)local_98 = *(undefined8 *)local_a0;
                    *(undefined8 *)(local_98 + 8) = *(undefined8 *)(local_a0 + 8);
                    *(undefined8 *)(local_98 + 0x10) = *(undefined8 *)(local_a0 + 0x10);
                    *(undefined8 *)(local_98 + 0x18) = *(undefined8 *)(local_a0 + 0x18);
                    local_98 = local_98 + 0x20;
                    local_a0 = local_a0 + 0x20;
                    local_a8 = local_2c8;
                    local_90 = local_2c8;
                  } while (local_98 < local_2c8);
                }
LAB_0031341d:
                local_2b8 = local_2c8;
              }
              goto LAB_00312488;
            }
            goto LAB_00314517;
          }
          local_308 = (byte *)((long)local_308 + 4);
          if (local_2c0 + -0x40 <= local_2b8 + (long)local_308) goto LAB_00313d4b;
          if (((local_284 != 1) && (local_2f0 < local_290)) || (local_2f8 < 8)) goto LAB_00312cff;
          *(undefined8 *)local_2b8 = *(undefined8 *)local_2f0;
          *(undefined8 *)(local_2b8 + 8) = *(undefined8 *)(local_2f0 + 8);
          *(undefined2 *)(local_2b8 + 0x10) = *(undefined2 *)(local_2f0 + 0x10);
          local_2b8 = local_308 + (long)local_2b8;
        } while( true );
      }
LAB_00313432:
      do {
        pbVar5 = local_2a8 + 1;
        local_2fc = (uint)*local_2a8;
        local_308 = (byte *)(ulong)(*local_2a8 >> 4);
        local_2a8 = pbVar5;
        if (local_27c == 0) {
          if (local_308 < 9) goto LAB_00313490;
LAB_00313653:
          if (local_308 == (byte *)0xf) {
            local_334 = 0;
            local_120 = local_2b0 + -0xf;
            local_118 = &local_2a8;
            local_124 = local_27c;
            local_128 = local_27c;
            local_130 = &local_334;
            local_134 = 0;
            if ((local_27c == 0) || (pbVar5 < local_120)) {
              do {
                local_138 = (uint)**local_118;
                *local_118 = *local_118 + 1;
                local_134 = local_138 + local_134;
                if ((local_124 != 0) && (local_120 <= *local_118)) {
                  *local_130 = -2;
                  local_10c = local_134;
                  break;
                }
                local_10c = local_134;
              } while (local_138 == 0xff);
            }
            else {
              local_334 = -1;
              local_10c = 0;
            }
            local_308 = (byte *)((ulong)local_10c + (long)local_308);
            if (((local_334 == -1) ||
                ((local_2d4 != 0 && (local_2b8 + (long)local_308 < local_2b8)))) ||
               ((local_134 = local_10c, local_2d4 != 0 && (local_2a8 + (long)local_308 < local_2a8))
               )) {
LAB_00314517:
              return -1 - ((int)local_2a8 - (int)local_268);
            }
          }
          local_2c8 = local_2b8 + (long)local_308;
          pbVar5 = local_2a8;
LAB_00313856:
          local_2a8 = pbVar5;
          if (((local_27c == 0) ||
              ((local_2c8 <= local_2c0 + -0xc && (local_2a8 + (long)local_308 <= local_2b0 + -8))))
             && ((local_27c != 0 || (local_2c8 <= local_2c0 + -8)))) {
            local_1a0 = local_2b8;
            local_1a8 = local_2a8;
            local_1b0 = local_2c8;
            local_1b8 = local_2b8;
            local_1c0 = local_2a8;
            local_1c8 = local_2c8;
            do {
              *(undefined8 *)local_1b8 = *(undefined8 *)local_1c0;
              local_1b8 = local_1b8 + 8;
              local_1c0 = local_1c0 + 8;
            } while (local_1b8 < local_2c8);
            local_2a8 = local_2a8 + (long)local_308;
            local_2b8 = local_2c8;
          }
          else {
            if (local_280 == 0) {
              if (((local_27c == 0) && (local_2c8 != local_2c0)) ||
                 ((local_27c != 0 &&
                  ((local_2a8 + (long)local_308 != local_2b0 || (local_2c0 < local_2c8))))))
              goto LAB_00314517;
            }
            else {
              if (local_2b0 < local_2a8 + (long)local_308) {
                local_308 = (byte *)((long)local_2b0 - (long)local_2a8);
                local_2c8 = local_2b8 + (long)local_308;
              }
              if (local_2c0 < local_2c8) {
                local_2c8 = local_2c0;
                local_308 = (byte *)((long)local_2c0 - (long)local_2b8);
              }
            }
            memmove(local_2b8,local_2a8,(size_t)local_308);
            local_2a8 = local_2a8 + (long)local_308;
            local_2b8 = local_2b8 + (long)local_308;
            if (((local_280 == 0) || (local_2c8 == local_2c0)) || (local_2b0 + -2 <= local_2a8))
            break;
          }
          UVar2 = LZ4_readLE16(in_stack_fffffffffffffc28);
          local_2f8 = (ulong)UVar2;
          local_2a8 = local_2a8 + 2;
          local_2f0 = local_2b8 + -local_2f8;
          local_308 = (byte *)(ulong)(local_2fc & 0xf);
        }
        else {
          if (local_308 == (byte *)0xf) goto LAB_00313653;
LAB_00313490:
          if (local_27c != 0 && local_2e0 <= pbVar5 || local_2e8 < local_2b8) goto LAB_00313653;
          iVar3 = 8;
          if (local_27c != 0) {
            iVar3 = 0x10;
          }
          memcpy(local_2b8,pbVar5,(long)iVar3);
          local_2b8 = local_2b8 + (long)local_308;
          local_2a8 = local_2a8 + (long)local_308;
          local_308 = (byte *)(ulong)(local_2fc & 0xf);
          UVar2 = LZ4_readLE16(in_stack_fffffffffffffc28);
          local_2f8 = (ulong)UVar2;
          local_2a8 = local_2a8 + 2;
          local_2f0 = local_2b8 + -local_2f8;
          if (((local_308 != (byte *)0xf) && (7 < local_2f8)) &&
             ((local_284 == 1 || (local_290 <= local_2f0)))) {
            *(undefined8 *)local_2b8 = *(undefined8 *)local_2f0;
            *(undefined8 *)(local_2b8 + 8) = *(undefined8 *)(local_2f0 + 8);
            *(undefined2 *)(local_2b8 + 0x10) = *(undefined2 *)(local_2f0 + 0x10);
            local_2b8 = local_2b8 + (long)local_308 + 4;
            goto LAB_00313432;
          }
        }
        if (local_308 == (byte *)0xf) {
          local_338 = 0;
          local_f0 = local_2b0 + -4;
          local_e8 = &local_2a8;
          local_f4 = local_27c;
          local_f8 = 0;
          local_100 = &local_338;
          local_104 = 0;
          do {
            local_108 = (uint)**local_e8;
            *local_e8 = *local_e8 + 1;
            local_104 = local_108 + local_104;
            if ((local_f4 != 0) && (local_f0 <= *local_e8)) {
              *local_100 = -2;
              local_dc = local_104;
              break;
            }
            local_dc = local_104;
          } while (local_108 == 0xff);
          local_308 = (byte *)((ulong)local_dc + (long)local_308);
          if ((local_338 != 0) ||
             ((local_104 = local_dc, local_2d4 != 0 && (local_2b8 + (long)local_308 < local_2b8))))
          goto LAB_00314517;
        }
        local_308 = (byte *)((long)local_308 + 4);
LAB_00313d4b:
        if ((local_2d8 != 0) && (local_2f0 + local_2a0 < local_290)) goto LAB_00314517;
        if ((local_284 == 2) && (local_2f0 < local_290)) {
          if (local_2c0 + -5 < local_2b8 + (long)local_308) {
            if (local_280 == 0) goto LAB_00314517;
            if (local_308 < local_2c0 + -(long)local_2b8) {
              local_3d0 = local_308;
            }
            else {
              local_3d0 = local_2c0 + -(long)local_2b8;
            }
            local_308 = local_3d0;
          }
          if (local_290 + -(long)local_2f0 < local_308) {
            __n = (long)local_290 - (long)local_2f0;
            __n_00 = (long)local_308 - __n;
            memcpy(local_2b8,(void *)(local_2d0 - __n),__n);
            local_2b8 = local_2b8 + __n;
            if ((ulong)((long)local_2b8 - (long)local_290) < __n_00) {
              pbVar5 = local_2b8 + __n_00;
              local_358 = local_290;
              while (local_2b8 < pbVar5) {
                *local_2b8 = *local_358;
                local_358 = local_358 + 1;
                local_2b8 = local_2b8 + 1;
              }
            }
            else {
              memcpy(local_2b8,local_290,__n_00);
              local_2b8 = local_2b8 + __n_00;
            }
          }
          else {
            memmove(local_2b8,(void *)(local_2d0 - ((long)local_290 - (long)local_2f0)),
                    (size_t)local_308);
            local_2b8 = local_308 + (long)local_2b8;
          }
          goto LAB_00313432;
        }
        local_2c8 = local_2b8 + (long)local_308;
        if ((local_280 == 0) || (local_2c8 <= local_2c0 + -0xc)) {
          if (local_2f8 < 8) {
            LZ4_write32(local_2b8,0);
            *local_2b8 = *local_2f0;
            local_2b8[1] = local_2f0[1];
            local_2b8[2] = local_2f0[2];
            local_2b8[3] = local_2f0[3];
            uVar1 = inc32table[local_2f8];
            *(undefined4 *)(local_2b8 + 4) = *(undefined4 *)(local_2f0 + uVar1);
            local_2f0 = local_2f0 + uVar1 + -(long)dec64table[local_2f8];
          }
          else {
            *(undefined8 *)local_2b8 = *(undefined8 *)local_2f0;
            local_2f0 = local_2f0 + 8;
          }
          pbVar5 = local_2b8 + 8;
          if (local_2c0 + -0xc < local_2c8) {
            pbVar4 = local_2c0 + -7;
            if (local_2c0 + -5 < local_2c8) goto LAB_00314517;
            local_2b8 = pbVar5;
            if (pbVar5 < pbVar4) {
              local_208 = local_2f0;
              local_220 = local_2f0;
              local_218 = pbVar5;
              do {
                *(undefined8 *)local_218 = *(undefined8 *)local_220;
                local_218 = local_218 + 8;
                local_220 = local_220 + 8;
              } while (local_218 < pbVar4);
              local_2f0 = local_2f0 + ((long)pbVar4 - (long)pbVar5);
              local_2b8 = pbVar4;
              local_200 = pbVar5;
              local_210 = pbVar4;
              local_228 = pbVar4;
            }
            while (local_2b8 < local_2c8) {
              *local_2b8 = *local_2f0;
              local_2f0 = local_2f0 + 1;
              local_2b8 = local_2b8 + 1;
            }
          }
          else {
            *(undefined8 *)pbVar5 = *(undefined8 *)local_2f0;
            if ((byte *)0x10 < local_308) {
              local_1d0 = local_2b8 + 0x10;
              local_1d8 = local_2f0 + 8;
              local_1e0 = local_2c8;
              local_1f8 = local_2c8;
              local_1f0 = local_1d8;
              local_1e8 = local_1d0;
              do {
                *(undefined8 *)local_1e8 = *(undefined8 *)local_1f0;
                local_1e8 = local_1e8 + 8;
                local_1f0 = local_1f0 + 8;
              } while (local_1e8 < local_2c8);
            }
          }
          local_2b8 = local_2c8;
          goto LAB_00313432;
        }
        in_stack_fffffffffffffc28 = local_308;
        if (local_2c0 + -(long)local_2b8 <= local_308) {
          in_stack_fffffffffffffc28 = local_2c0 + -(long)local_2b8;
        }
        pbVar5 = local_2b8 + (long)in_stack_fffffffffffffc28;
        if (local_2b8 < local_2f0 + (long)in_stack_fffffffffffffc28) {
          while (local_2b8 < pbVar5) {
            *local_2b8 = *local_2f0;
            local_2f0 = local_2f0 + 1;
            local_2b8 = local_2b8 + 1;
          }
        }
        else {
          memcpy(local_2b8,local_2f0,(size_t)in_stack_fffffffffffffc28);
        }
        local_2b8 = pbVar5;
      } while (pbVar5 != local_2c0);
      if (local_27c == 0) {
        local_25c = (int)local_2a8 - (int)local_268;
      }
      else {
        local_25c = (int)local_2b8 - (int)local_270;
      }
    }
  }
  return local_25c;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}